

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_898aa::TransformSelectorAt::~TransformSelectorAt(TransformSelectorAt *this)

{
  TransformSelectorAt *this_local;
  
  ~TransformSelectorAt(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TransformSelectorAt(std::vector<index_type> const& indexes)
    : TransformSelectorIndexes("AT", indexes)
  {
  }